

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.hpp
# Opt level: O2

void __thiscall
helics::ActionMessage::setStringData(ActionMessage *this,string_view string1,string_view string2)

{
  string_view string2_local;
  string_view string1_local;
  
  string2_local._M_str = string2._M_str;
  string2_local._M_len = string2._M_len;
  string1_local._M_str = string1._M_str;
  string1_local._M_len = string1._M_len;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->stringData,2);
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)
             (this->stringData).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&string1_local);
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)
             ((this->stringData).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1),&string2_local);
  return;
}

Assistant:

void setStringData(std::string_view string1, std::string_view string2)
    {
        stringData.resize(2);
        stringData[0] = string1;
        stringData[1] = string2;
    }